

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O1

void __thiscall
TPZTransfer<std::complex<float>_>::ExpandDoubleValueEntries
          (TPZTransfer<std::complex<float>_> *this,int num)

{
  long lVar1;
  
  lVar1 = (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc;
  if (lVar1 < (long)num + (long)this->fDoubleValLastUsed) {
    TPZManVector<std::complex<float>,_10>::Expand(&this->fDoubleValues,lVar1 + 4000);
  }
  TPZManVector<std::complex<float>,_10>::Resize
            (&this->fDoubleValues,
             (long)(num + (int)(this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements))
  ;
  return;
}

Assistant:

void TPZTransfer<TVar>::ExpandDoubleValueEntries(int num){
	if(fDoubleValLastUsed+num > fDoubleValues.NAlloc()) {
		fDoubleValues.Expand(fDoubleValues.NAlloc()+4000);
		//    Print("After the double value expansion");
	}
	int nextsize = fDoubleValues.NElements()+num;
	fDoubleValues.Resize(nextsize);
}